

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

utf8_size_t utf8_wrap_length(utf8_char_t *data,utf8_size_t size)

{
  byte bVar1;
  utf8_size_t uVar2;
  utf8_size_t uVar3;
  size_t split_at;
  long lVar4;
  utf8_size_t uVar5;
  
  uVar3 = 0;
  uVar5 = size;
  do {
    bVar1 = *data;
    if ((bVar1 == 10) || (bVar1 == 0xd)) {
      return uVar3;
    }
    uVar2 = uVar3;
    if (bVar1 < 0x21) {
      if (bVar1 != 0) goto LAB_00107fba;
      lVar4 = 0;
    }
    else {
      if (((bVar1 != 0x7f) && (uVar2 = uVar5, bVar1 == 0xc2)) && (((byte *)data)[1] == 0xa0)) {
        uVar2 = uVar3;
      }
LAB_00107fba:
      lVar4 = *(long *)((long)utf8_char_length::_utf8_char_length + (ulong)(bVar1 & 0xfffffff8));
    }
    data = (utf8_char_t *)((byte *)data + lVar4);
    uVar3 = uVar3 + 1;
    uVar5 = uVar2;
    if (size < uVar3) {
      return uVar2;
    }
  } while( true );
}

Assistant:

utf8_size_t utf8_wrap_length(const utf8_char_t* data, utf8_size_t size)
{
    // Set split_at to size, so if a split point cna not be found, retuns the size passed in
    size_t char_length, char_count, split_at = size;

    for (char_count = 0; char_count <= size; ++char_count) {
        if (_utf8_newline(data)) {
            return char_count;
        } else if (utf8_char_whitespace(data)) {
            split_at = char_count;
        }

        char_length = utf8_char_length(data);
        data += char_length;
    }

    return split_at;
}